

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O3

Expression_node *
lossless_neural_sound::expression_compiler::expression::
Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::make_tree<>
          (Arena *arena,Nodes *nodes,Expression_node **leaves,size_t leaf_count)

{
  Expression_node *pEVar1;
  ulong leaf_count_00;
  Product local_78;
  
  if (leaf_count == 1) {
    pEVar1 = *leaves;
  }
  else {
    if (leaf_count == 0) {
      __assert_fail("leaf_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                    ,0x371,
                    "static const Expression_node *lossless_neural_sound::expression_compiler::expression::Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::make_tree(Arena &, Nodes &, const Expression_node *const *, std::size_t, const Args &...) [Derived_class = lossless_neural_sound::expression_compiler::expression::Product, Args = <>]"
                   );
    }
    leaf_count_00 = leaf_count >> 1;
    pEVar1 = make_tree<>(arena,nodes,leaves,leaf_count_00);
    local_78.super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>.
    right_node = make_tree<>(arena,nodes,leaves + leaf_count_00,leaf_count - leaf_count_00);
    local_78.super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>.
    super_Expression_node.aa_tree_node.left_child = (Expression_node *)0x0;
    local_78.super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>.
    super_Expression_node.aa_tree_node.right_child = (Expression_node *)0x0;
    local_78.super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>.
    super_Expression_node.super_Node.hash_next = (Node *)0x0;
    local_78.super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>.
    super_Expression_node.aa_tree_node.parent = (Expression_node *)0x0;
    local_78.super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>.
    super_Expression_node.aa_tree_node.tree_size = 1;
    local_78.super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>.
    super_Expression_node.aa_tree_node.tree_level = 1;
    local_78.super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>.
    super_Expression_node.super_Node._vptr_Node = (_func_int **)&PTR__Node_001278e0;
    local_78.super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>.
    left_node = pEVar1;
    pEVar1 = (Expression_node *)
             Nodes::intern<lossless_neural_sound::expression_compiler::expression::Product>
                       (nodes,arena,&local_78);
  }
  return pEVar1;
}

Assistant:

static const Expression_node *make_tree(Arena &arena,
                                            Nodes &nodes,
                                            const Expression_node *const *leaves,
                                            std::size_t leaf_count,
                                            const Args &... args)
    {
        assert(leaf_count != 0);
        if(leaf_count == 1)
            return leaves[0];
        std::size_t split_index = leaf_count / 2;
        const Expression_node *left_node = make_tree(arena, nodes, leaves, split_index, args...);
        const Expression_node *right_node =
            make_tree(arena, nodes, leaves + split_index, leaf_count - split_index, args...);
        return nodes.intern(arena, Derived_class(left_node, right_node, args...));
    }